

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractfileengine.cpp
# Opt level: O2

void __thiscall
QAbstractFileEngineHandlerList::~QAbstractFileEngineHandlerList
          (QAbstractFileEngineHandlerList *this)

{
  QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_fileEngineHandlerMutex>_>::
  operator()((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_fileEngineHandlerMutex>_>
              *)this);
  qt_abstractfileenginehandlerlist_shutDown = 1;
  QArrayDataPointer<QAbstractFileEngineHandler_*>::~QArrayDataPointer
            ((QArrayDataPointer<QAbstractFileEngineHandler_*> *)this);
  return;
}

Assistant:

~QAbstractFileEngineHandlerList()
    {
        QWriteLocker locker(fileEngineHandlerMutex());
        qt_abstractfileenginehandlerlist_shutDown = true;
    }